

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::ExternalCommand::isResultValid
          (ExternalCommand *this,BuildSystem *system,BuildValue *value)

{
  BuildNode *this_00;
  bool bVar1;
  FileSystem *fileSystem;
  FileInfo *this_01;
  ulong uVar2;
  ulong uVar3;
  FileInfo info;
  FileInfo local_80;
  
  if ((this->alwaysOutOfDate == false) &&
     ((value->kind == SuccessfulCommandWithOutputSignature || (value->kind == SuccessfulCommand))))
  {
    uVar2 = (ulong)((long)(this->super_Command).outputs.
                          super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_Command).outputs.
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    bVar1 = true;
    if ((int)uVar2 != 0) {
      uVar3 = 0;
      do {
        this_00 = (this->super_Command).outputs.
                  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3];
        if (this_00->type != Virtual) {
          fileSystem = BuildSystem::getFileSystem(system);
          BuildNode::getFileInfo(&local_80,this_00,fileSystem);
          bVar1 = this_00->mutated;
          this_01 = BuildValue::getNthOutputInfo(value,(uint)uVar3);
          if (bVar1 == true) {
            bVar1 = basic::FileInfo::isMissing(this_01);
            if ((((local_80.device == 0) && (local_80.inode == 0)) && (local_80.mode == 0)) &&
               ((local_80.size == 0 && (local_80.modTime.seconds == 0)))) {
              if (bVar1 != (local_80.modTime.nanoseconds == 0)) goto LAB_00134b5b;
            }
            else if (bVar1) goto LAB_00134b5b;
          }
          else {
            bVar1 = basic::FileInfo::operator==(this_01,&local_80);
            if (!bVar1) goto LAB_00134b5b;
          }
        }
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0xffffffff) != uVar3);
      bVar1 = true;
    }
  }
  else {
LAB_00134b5b:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ExternalCommand::isResultValid(BuildSystem& system,
                                    const BuildValue& value) {
  // Treat the command as always out-of-date, if requested.
  if (alwaysOutOfDate)
    return false;
      
  // If the prior value wasn't for a successful command, recompute.
  if (!value.isSuccessfulCommand())
    return false;
    
  // Check the timestamps on each of the outputs.
  for (unsigned i = 0, e = outputs.size(); i != e; ++i) {
    auto* node = outputs[i];

    // Ignore virtual outputs.
    if (node->isVirtual())
      continue;

    // Rebuild if the output information has changed.
    //
    // We intentionally allow missing outputs here, as long as they haven't
    // changed. This is under the assumption that the commands themselves are
    // behaving correctly when they exit successfully, and that downstream
    // commands would diagnose required missing inputs.
    //
    // FIXME: CONSISTENCY: One consistency issue in this model currently is that
    // if the output was missing, then appears, nothing will remove it; that
    // results in an inconsistent build. What would be nice if we supported
    // per-edge annotations on whether an output was optional -- in that case we
    // could enforce and error on the missing output if not annotated, and we
    // could enable behavior to remove such output files if annotated prior to
    // running the command.
    auto info = node->getFileInfo(system.getFileSystem());

    // If this output is mutated by the build, we can't rely on equivalence,
    // only existence.
    if (node->isMutated()) {
      if (value.getNthOutputInfo(i).isMissing() != info.isMissing())
        return false;
      continue;
    }

    if (value.getNthOutputInfo(i) != info)
      return false;
  }

  // Otherwise, the result is ok.
  return true;
}